

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O2

void __thiscall re2::RegexpStatus::set_tmp(RegexpStatus *this,string *tmp)

{
  string *this_00;
  
  this_00 = this->tmp_;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00);
  this->tmp_ = tmp;
  return;
}

Assistant:

void set_tmp(string* tmp) { delete tmp_; tmp_ = tmp; }